

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O0

Slice leveldb::test::RandomString(Random *rnd,int len,string *dst)

{
  uint32_t uVar1;
  char *pcVar2;
  int local_34;
  int i;
  string *dst_local;
  int len_local;
  Random *rnd_local;
  
  std::__cxx11::string::resize((ulong)dst);
  for (local_34 = 0; local_34 < len; local_34 = local_34 + 1) {
    uVar1 = Random::Uniform(rnd,0x5f);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)dst);
    *pcVar2 = (char)uVar1 + ' ';
  }
  Slice::Slice((Slice *)&rnd_local,dst);
  return _rnd_local;
}

Assistant:

Slice RandomString(Random* rnd, int len, std::string* dst) {
  dst->resize(len);
  for (int i = 0; i < len; i++) {
    (*dst)[i] = static_cast<char>(' ' + rnd->Uniform(95));  // ' ' .. '~'
  }
  return Slice(*dst);
}